

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O2

llama_model *
llama_model_load_from_file_impl
          (string *path_model,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,llama_model_params params)

{
  pointer ppgVar1;
  ggml_backend_device *pgVar2;
  ggml_log_level level;
  bool bVar3;
  int iVar4;
  llama_model *this;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  ggml_backend_dev_t *dev;
  ggml_backend_dev_t *__x;
  int iVar9;
  size_t i;
  char *pcVar10;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *this_00;
  ulong uVar11;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *this_01;
  pointer ppgVar12;
  uint cur_percentage;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> rpc_servers;
  ggml_backend_dev_t dev_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_198;
  string *local_190;
  time_meas tm;
  ggml_backend_dev_t main_gpu;
  
  local_190 = path_model;
  ggml_time_init();
  cur_percentage = 0;
  if (params.progress_callback == (llama_progress_callback)0x0) {
    params.progress_callback_user_data = &cur_percentage;
    params.progress_callback = llama_model_load_from_file_impl::anon_class_1_0_00000001::__invoke;
  }
  this = (llama_model *)operator_new(0x1ac0);
  llama_model::llama_model(this,&params);
  local_198 = splits;
  if (params.devices == (ggml_backend_dev_t *)0x0) {
    rpc_servers.super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rpc_servers.super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rpc_servers.super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = &this->devices;
    for (uVar11 = 0; uVar5 = ggml_backend_dev_count(), uVar11 < uVar5; uVar11 = uVar11 + 1) {
      dev_1 = (ggml_backend_dev_t)ggml_backend_dev_get(uVar11);
      iVar4 = ggml_backend_dev_type(dev_1);
      if (iVar4 == 1) {
        uVar6 = ggml_backend_dev_backend_reg(dev_1);
        pcVar10 = (char *)ggml_backend_reg_name(uVar6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&main_gpu,"RPC",(allocator<char> *)&tm);
        bVar3 = std::operator==(pcVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&main_gpu);
        std::__cxx11::string::~string((string *)&main_gpu);
        this_00 = this_01;
        if (bVar3) {
          this_00 = &rpc_servers;
        }
        std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                  (this_00,&dev_1);
      }
    }
    if (rpc_servers.
        super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        rpc_servers.
        super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
      insert<__gnu_cxx::__normal_iterator<ggml_backend_device**,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>,void>
                ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)this_01,
                 (const_iterator)
                 (this_01->
                 super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>).
                 _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                  )rpc_servers.
                   super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                  )rpc_servers.
                   super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::_Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::~_Vector_base
              (&rpc_servers.
                super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>);
  }
  else {
    for (__x = params.devices; *__x != (value_type)0x0; __x = __x + 1) {
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                (&this->devices,__x);
    }
  }
  if (params.split_mode == LLAMA_SPLIT_MODE_NONE) {
    lVar8 = (long)params.main_gpu;
    if (lVar8 < 0) {
      uVar11 = (ulong)((long)(this->devices).
                             super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->devices).
                            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
    }
    else {
      ppgVar12 = (this->devices).
                 super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppgVar1 = (this->devices).
                super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar11 = (ulong)((long)ppgVar1 - (long)ppgVar12) >> 3;
      if (params.main_gpu < (int)uVar11) {
        main_gpu = ppgVar12[lVar8];
        if (ppgVar1 != ppgVar12) {
          (this->devices).
          super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppgVar12;
        }
        std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                  (&this->devices,&main_gpu);
        goto LAB_001c56dc;
      }
    }
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: invalid value for main_gpu: %d (available devices: %d)\n",
                       "llama_model_load_from_file_impl",lVar8,uVar11);
  }
  else {
LAB_001c56dc:
    ppgVar1 = (this->devices).
              super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppgVar12 = (this->devices).
                    super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppgVar12 != ppgVar1;
        ppgVar12 = ppgVar12 + 1) {
      pgVar2 = *ppgVar12;
      ggml_backend_dev_memory(pgVar2,&main_gpu,&rpc_servers);
      uVar6 = ggml_backend_dev_name(pgVar2);
      uVar7 = ggml_backend_dev_description(pgVar2);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: using device %s (%s) - %zu MiB free\n",
                         "llama_model_load_from_file_impl",uVar6,uVar7,(ulong)main_gpu >> 0x14);
    }
    this->t_load_us = 0;
    time_meas::time_meas(&tm,&this->t_load_us,false);
    this->t_start_us = tm.t_start_us;
    llama_model_loader::llama_model_loader
              ((llama_model_loader *)&main_gpu,local_190,local_198,params.use_mmap,
               params.check_tensors,params.kv_overrides,params.tensor_buft_overrides);
    llama_model_loader::print_info((llama_model_loader *)&main_gpu);
    (this->hparams).vocab_only = params.vocab_only;
    llama_model::load_arch(this,(llama_model_loader *)&main_gpu);
    llama_model::load_hparams(this,(llama_model_loader *)&main_gpu);
    llama_model::load_vocab(this,(llama_model_loader *)&main_gpu);
    llama_model::load_stats(this,(llama_model_loader *)&main_gpu);
    llama_model::print_info(this);
    if (params.vocab_only == true) {
      bVar3 = false;
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: vocab only - skipping tensors\n",
                         "llama_model_load");
      iVar4 = 0;
    }
    else {
      bVar3 = llama_model::load_tensors(this,(llama_model_loader *)&main_gpu);
      iVar4 = -2;
    }
    llama_model_loader::~llama_model_loader((llama_model_loader *)&main_gpu);
    iVar9 = 0;
    if (bVar3 == false) {
      iVar9 = iVar4;
    }
    time_meas::~time_meas(&tm);
    if (-1 < iVar9) {
      return this;
    }
    if (iVar9 == -1) {
      pcVar10 = "%s: failed to load model\n";
      level = GGML_LOG_LEVEL_ERROR;
    }
    else {
      pcVar10 = "%s: cancelled model load\n";
      level = GGML_LOG_LEVEL_INFO;
    }
    llama_log_internal(level,pcVar10,"llama_model_load_from_file_impl");
  }
  llama_model_free(this);
  return (llama_model *)0x0;
}

Assistant:

static struct llama_model * llama_model_load_from_file_impl(
        const std::string & path_model,
        std::vector<std::string> & splits,
        struct llama_model_params params) {
    ggml_time_init();

    unsigned cur_percentage = 0;
    if (params.progress_callback == NULL) {
        params.progress_callback_user_data = &cur_percentage;
        params.progress_callback = [](float progress, void * ctx) {
            unsigned * cur_percentage_p = (unsigned *) ctx;
            unsigned percentage = (unsigned) (100 * progress);
            while (percentage > *cur_percentage_p) {
                *cur_percentage_p = percentage;
                LLAMA_LOG_CONT(".");
                if (percentage >= 100) {
                    LLAMA_LOG_CONT("\n");
                }
            }
            return true;
        };
    }

    llama_model * model = new llama_model(params);

    // create list of devices to use with this model
    if (params.devices) {
        for (ggml_backend_dev_t * dev = params.devices; *dev; ++dev) {
            model->devices.push_back(*dev);
        }
    } else {
        std::vector<ggml_backend_dev_t> rpc_servers;
        // use all available devices
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev = ggml_backend_dev_get(i);
            switch (ggml_backend_dev_type(dev)) {
                case GGML_BACKEND_DEVICE_TYPE_CPU:
                case GGML_BACKEND_DEVICE_TYPE_ACCEL:
                    // skip CPU backends since they are handled separately
                    break;

                case GGML_BACKEND_DEVICE_TYPE_GPU:
                    ggml_backend_reg_t reg = ggml_backend_dev_backend_reg(dev);
                    if (ggml_backend_reg_name(reg) == std::string("RPC")) {
                        rpc_servers.push_back(dev);
                    } else {
                        model->devices.push_back(dev);
                    }
                    break;
            }
        }
        // add RPC servers at the front of the list
        if (!rpc_servers.empty()) {
            model->devices.insert(model->devices.begin(), rpc_servers.begin(), rpc_servers.end());
        }
    }

    // if using single GPU mode, remove all except the main GPU
    if (params.split_mode == LLAMA_SPLIT_MODE_NONE) {
        if (params.main_gpu < 0 || params.main_gpu >= (int)model->devices.size()) {
            LLAMA_LOG_ERROR("%s: invalid value for main_gpu: %d (available devices: %d)\n", __func__, params.main_gpu, (int)model->devices.size());
            llama_model_free(model);
            return nullptr;
        }
        ggml_backend_dev_t main_gpu = model->devices[params.main_gpu];
        model->devices.clear();
        model->devices.push_back(main_gpu);
    }

    for (auto * dev : model->devices) {
        size_t free, total; // NOLINT
        ggml_backend_dev_memory(dev, &free, &total);
        LLAMA_LOG_INFO("%s: using device %s (%s) - %zu MiB free\n", __func__, ggml_backend_dev_name(dev), ggml_backend_dev_description(dev), free/1024/1024);
    }

    const int status = llama_model_load(path_model, splits, *model, params);
    GGML_ASSERT(status <= 0);
    if (status < 0) {
        if (status == -1) {
            LLAMA_LOG_ERROR("%s: failed to load model\n", __func__);
        } else if (status == -2) {
            LLAMA_LOG_INFO("%s: cancelled model load\n", __func__);
        }

        llama_model_free(model);
        return nullptr;
    }

    return model;
}